

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag_builder.h
# Opt level: O3

void __thiscall ccs::DagBuilder::DagBuilder(DagBuilder *this,shared_ptr<ccs::CcsTracer> *tracer)

{
  Node *this_00;
  shared_ptr<ccs::CcsTracer> local_38;
  
  this->nextProperty_ = 0;
  this_00 = (Node *)operator_new(0x108);
  local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (tracer->super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (tracer->super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (tracer->super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (tracer->super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  Node::Node(this_00,&local_38);
  (this->root_).super___shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ccs::Node*>
            (&(this->root_).super___shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             this_00);
  if (local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  BuildContext::descendant
            ((BuildContext *)&this->buildContext_,this,
             (this->root_).super___shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

DagBuilder(std::shared_ptr<CcsTracer> tracer) :
    nextProperty_(0),
    root_(new Node(std::move(tracer))),
    buildContext_(BuildContext::descendant(*this, *root_)) {}